

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_test.cc
# Opt level: O0

void __thiscall
security::pawn::anon_unknown_0::BitsTest_RawBits_Test::TestBody(BitsTest_RawBits_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_70;
  Message local_68;
  int local_5c;
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_> local_58;
  EqMatcher<int> local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_1;
  Message local_38;
  int local_2c;
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_> local_28;
  EqMatcher<int> local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  BitsTest_RawBits_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28.rhs_ = (int)testing::Eq<int>(0x8000);
  local_24.super_ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>.rhs_ =
       (ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>)
       testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>
                 ((EqMatcher<int>)local_28.rhs_);
  local_2c = bits::Raw<15,15,int>(0xffff);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>::operator()
            (local_20,(char *)&local_24,(int *)"bits::Raw<15>(0xFFFF)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/pawn/bits_test.cc",
               0xd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_58.rhs_ = (int)testing::Eq<int>(0x7c);
  local_54.super_ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>.rhs_ =
       (ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>)
       testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>
                 ((EqMatcher<int>)local_58.rhs_);
  local_5c = bits::Raw<6,2,int>(0xff);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>::operator()
            (local_50,(char *)&local_54,(int *)"(bits::Raw<6, 2>(0xFF))");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/pawn/bits_test.cc",
               0xe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  return;
}

Assistant:

TEST(BitsTest, RawBits) {
  EXPECT_THAT(bits::Raw<15>(0xFFFF), Eq(0x8000));  // 1000 0000 0000 0000
  EXPECT_THAT((bits::Raw<6, 2>(0xFF)), Eq(0x7C));  //           0111 1100
}